

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

void free_timer(JSRuntime *rt,JSOSTimer *th)

{
  JSValue v;
  JSRuntime *in_RSI;
  JSValueUnion in_RDI;
  int64_t unaff_retaddr;
  void *in_stack_ffffffffffffffe8;
  
  v.tag = unaff_retaddr;
  v.u.float64 = in_RDI.float64;
  JS_FreeValueRT(in_RSI,v);
  js_free_rt(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void free_timer(JSRuntime *rt, JSOSTimer *th)
{
    JS_FreeValueRT(rt, th->func);
    js_free_rt(rt, th);
}